

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_carith.c
# Opt level: O1

uint64_t lj_carith_check64(lua_State *L,int narg,CTypeID *id)

{
  ushort uVar1;
  uint uVar2;
  CType *pCVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  CType *s;
  CTypeID CVar7;
  CTState *cts;
  uint8_t *sp;
  TValue *o;
  uint64_t x;
  uint64_t local_20;
  
  o = L->base + (long)narg + -1;
  if (L->top <= o) goto LAB_0014ec64;
  uVar2 = *(uint *)((long)L->base + (long)narg * 8 + -4);
  if (uVar2 < 0xffff0000) {
LAB_0014ebc5:
    return (ulong)(o->n + 6755399441055744.0) & 0xffffffff;
  }
  if ((short)uVar2 == -5) {
    iVar5 = lj_strscan_num((GCstr *)(ulong)(o->u32).lo,o);
    if (iVar5 == 0) {
LAB_0014ec64:
      lj_err_argt(L,narg,3);
    }
    goto LAB_0014ebc5;
  }
  if ((uVar2 & 0xffff) != 0xfff5) goto LAB_0014ec64;
  cts = (CTState *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x194);
  cts->L = L;
  uVar1 = *(ushort *)((ulong)(o->u32).lo + 6);
  uVar4 = (uint)uVar1;
  sp = (uint8_t *)((ulong)(o->u32).lo + 8);
  uVar2 = cts->tab[uVar1].info;
  if ((uVar2 & 0xf0800000) == 0x20800000) {
    sp = *(uint8_t **)sp;
    uVar4 = uVar2 & 0xffff;
  }
  pCVar3 = cts->tab;
  uVar6 = (ulong)uVar4 * 0x10;
  if ((pCVar3[uVar4].info & 0xf0000000) == 0x50000000) {
    uVar6 = (ulong)((pCVar3[uVar4].info & 0xffff) << 4);
  }
  s = (CType *)((long)&pCVar3->info + uVar6);
  if (((s->info & 0xfc800000) != 0x800000) || (CVar7 = 0xc, s->size != 8)) {
    if (*id != 0) goto LAB_0014ecab;
    CVar7 = 0xb;
  }
  *id = CVar7;
LAB_0014ecab:
  lj_cconv_ct_ct(cts,pCVar3 + *id,s,(uint8_t *)&local_20,sp,narg << 8);
  return local_20;
}

Assistant:

uint64_t lj_carith_check64(lua_State *L, int narg, CTypeID *id)
{
  TValue *o = L->base + narg-1;
  if (o >= L->top) {
  err:
    lj_err_argt(L, narg, LUA_TNUMBER);
  } else if (LJ_LIKELY(tvisnumber(o))) {
    /* Handled below. */
  } else if (tviscdata(o)) {
    CTState *cts = ctype_cts(L);
    uint8_t *sp = (uint8_t *)cdataptr(cdataV(o));
    CTypeID sid = cdataV(o)->ctypeid;
    CType *s = ctype_get(cts, sid);
    uint64_t x;
    if (ctype_isref(s->info)) {
      sp = *(void **)sp;
      sid = ctype_cid(s->info);
    }
    s = ctype_raw(cts, sid);
    if (ctype_isenum(s->info)) s = ctype_child(cts, s);
    if ((s->info & (CTMASK_NUM|CTF_BOOL|CTF_FP|CTF_UNSIGNED)) ==
	CTINFO(CT_NUM, CTF_UNSIGNED) && s->size == 8)
      *id = CTID_UINT64;  /* Use uint64_t, since it has the highest rank. */
    else if (!*id)
      *id = CTID_INT64;  /* Use int64_t, unless already set. */
    lj_cconv_ct_ct(cts, ctype_get(cts, *id), s,
		   (uint8_t *)&x, sp, CCF_ARG(narg));
    return x;
  } else if (!(tvisstr(o) && lj_strscan_number(strV(o), o))) {
    goto err;
  }
  if (LJ_LIKELY(tvisint(o))) {
    return (uint32_t)intV(o);
  } else {
    return (uint32_t)lj_num2bit(numV(o));
  }
}